

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::ZmpTrackingGainEstimator::ZmpTrackingGainEstimator
          (ZmpTrackingGainEstimator *this,double dt,Vector2 *zmpMeasureErrorStd,
          Vector3 *gainDriftPerSecond,Vector2 *zmpProcessErrorStd,double minimumGain,
          Vector2 *initZMP,Vector3 *initGain,Vector2 *initZMPUncertainty,
          Vector3 *initGainUncertainty)

{
  Matrix25 *other;
  double dVar1;
  Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false> local_58;
  
  this->dt_ = dt;
  this->minimumGain_ = minimumGain;
  dVar1 = (zmpMeasureErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
          m_storage.m_data.array[1];
  (this->zmpMeasureErrorstd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[0] =
       (zmpMeasureErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
       m_data.array[0];
  (this->zmpMeasureErrorstd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[1] = dVar1;
  dVar1 = (gainDriftPerSecond->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1];
  (this->gainDriftPerSecondStd_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (gainDriftPerSecond->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
       m_data.array[0];
  (this->gainDriftPerSecondStd_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar1;
  (this->gainDriftPerSecondStd_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] =
       (gainDriftPerSecond->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
       m_data.array[2];
  dVar1 = (zmpProcessErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
          m_storage.m_data.array[1];
  (this->zmpProcessErrorStd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[0] =
       (zmpProcessErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
       m_data.array[0];
  (this->zmpProcessErrorStd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[1] = dVar1;
  LinearKalmanFilter::LinearKalmanFilter(&this->filter_,5,2,0);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_true>::run(&this->A_);
  other = &this->C_;
  local_58.super_BlockImpl<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_true>.m_startRow.m_value
       = 0;
  local_58.super_BlockImpl<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_true>.m_startCol.m_value
       = 0;
  local_58.super_BlockImpl<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_true>.m_outerStride = 2;
  local_58.super_BlockImpl<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>,_0>.m_data =
       (PointerType)other;
  local_58.super_BlockImpl<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_true>.m_xpr = other;
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>,_false>::run
            (&local_58);
  Eigen::DenseBase<Eigen::Matrix<double,2,5,0,2,5>>::bottomRightCorner<2,3>((Type *)&local_58,other)
  ;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_3,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_3,_false>_> *)
             &local_58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,2,5,0,2,5>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_58,
             (DenseBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_> *)other);
  KalmanFilterBase::setC(&(this->filter_).super_KalmanFilterBase,(Cmatrix *)&local_58);
  free(local_58.super_BlockImpl<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_5,_0,_2,_5>,_2,_2,_false>,_0>.m_data);
  Eigen::DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&this->Q_);
  resetWithMeasurements(this,initZMP,initGain,0.0,initZMPUncertainty,initGainUncertainty);
  return;
}

Assistant:

ZmpTrackingGainEstimator::ZmpTrackingGainEstimator(double dt,
                                                   const Vector2 & zmpMeasureErrorStd,
                                                   const Vector3 & gainDriftPerSecond,
                                                   const Vector2 & zmpProcessErrorStd,
                                                   double minimumGain,
                                                   const Vector2 & initZMP,
                                                   const Vector3 & initGain,
                                                   const Vector2 & initZMPUncertainty,
                                                   const Vector3 & initGainUncertainty)
: dt_(dt), minimumGain_(minimumGain), zmpMeasureErrorstd_(zmpMeasureErrorStd),
  gainDriftPerSecondStd_(gainDriftPerSecond), zmpProcessErrorStd_(zmpProcessErrorStd), filter_(5, 2, 0)
{
  A_.setIdentity();
  C_.topLeftCorner<2, 2>().setIdentity();
  C_.bottomRightCorner<2, 3>().setZero();
  filter_.setC(C_);
  Q_.setZero();
  resetWithMeasurements(initZMP, initGain, 0., initZMPUncertainty, initGainUncertainty);
}